

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void * alloc_small(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  long lVar1;
  long lVar2;
  j_common_ptr cinfo_00;
  ulong in_RDX;
  int in_ESI;
  long *in_RDI;
  size_t slop;
  size_t min_request;
  size_t odd_bytes;
  char *data_ptr;
  small_pool_ptr_conflict prev_hdr_ptr;
  small_pool_ptr_conflict hdr_ptr;
  my_mem_ptr mem;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  j_common_ptr in_stack_ffffffffffffffb0;
  undefined8 *local_30;
  undefined8 *local_28;
  ulong local_18;
  
  lVar1 = in_RDI[1];
  if (0x3b9ac9e8 < in_RDX) {
    out_of_memory(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  local_18 = in_RDX;
  if ((in_RDX & 7) != 0) {
    local_18 = (8 - (in_RDX & 7)) + in_RDX;
  }
  if ((in_ESI < 0) || (1 < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xf;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_30 = (undefined8 *)0x0;
  for (local_28 = *(undefined8 **)(lVar1 + 0x68 + (long)in_ESI * 8);
      (local_28 != (undefined8 *)0x0 && ((ulong)local_28[2] < local_18));
      local_28 = (undefined8 *)*local_28) {
    local_30 = local_28;
  }
  if (local_28 == (undefined8 *)0x0) {
    lVar2 = local_18 + 0x18;
    if (local_30 == (undefined8 *)0x0) {
      cinfo_00 = (j_common_ptr)first_pool_slop[in_ESI];
    }
    else {
      cinfo_00 = (j_common_ptr)extra_pool_slop[in_ESI];
    }
    if ((j_common_ptr)(1000000000U - lVar2) < cinfo_00) {
      cinfo_00 = (j_common_ptr)(1000000000 - lVar2);
    }
    while (local_28 = (undefined8 *)
                      jpeg_get_small(cinfo_00,CONCAT44(in_stack_ffffffffffffffac,
                                                       in_stack_ffffffffffffffa8)),
          local_28 == (undefined8 *)0x0) {
      cinfo_00 = (j_common_ptr)((ulong)cinfo_00 >> 1);
      if (cinfo_00 < (j_common_ptr)0x32) {
        out_of_memory(cinfo_00,in_stack_ffffffffffffffac);
      }
    }
    *(long *)(lVar1 + 0x98) = (long)&cinfo_00->client_data + *(long *)(lVar1 + 0x98) + lVar2 + -0x18
    ;
    *local_28 = 0;
    local_28[1] = 0;
    local_28[2] = (long)&cinfo_00->err + local_18;
    if (local_30 == (undefined8 *)0x0) {
      *(undefined8 **)(lVar1 + 0x68 + (long)in_ESI * 8) = local_28;
    }
    else {
      *local_30 = local_28;
    }
  }
  lVar1 = local_28[1];
  local_28[1] = local_18 + local_28[1];
  local_28[2] = local_28[2] - local_18;
  return (void *)((long)local_28 + lVar1 + 0x18);
}

Assistant:

METHODDEF(void *)
alloc_small (j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "small" object */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  small_pool_ptr hdr_ptr, prev_hdr_ptr;
  char * data_ptr;
  size_t odd_bytes, min_request, slop;

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if (sizeofobject > (size_t) (MAX_ALLOC_CHUNK-SIZEOF(small_pool_hdr)))
    out_of_memory(cinfo, 1);	/* request exceeds malloc's ability */

  /* Round up the requested size to a multiple of SIZEOF(ALIGN_TYPE) */
  odd_bytes = sizeofobject % SIZEOF(ALIGN_TYPE);
  if (odd_bytes > 0)
    sizeofobject += SIZEOF(ALIGN_TYPE) - odd_bytes;

  /* See if space is available in any existing pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */
  prev_hdr_ptr = NULL;
  hdr_ptr = mem->small_list[pool_id];
  while (hdr_ptr != NULL) {
    if (hdr_ptr->hdr.bytes_left >= sizeofobject)
      break;			/* found pool with enough space */
    prev_hdr_ptr = hdr_ptr;
    hdr_ptr = hdr_ptr->hdr.next;
  }

  /* Time to make a new pool? */
  if (hdr_ptr == NULL) {
    /* min_request is what we need now, slop is what will be leftover */
    min_request = sizeofobject + SIZEOF(small_pool_hdr);
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      slop = first_pool_slop[pool_id];
    else
      slop = extra_pool_slop[pool_id];
    /* Don't ask for more than MAX_ALLOC_CHUNK */
    if (slop > (size_t) (MAX_ALLOC_CHUNK-min_request))
      slop = (size_t) (MAX_ALLOC_CHUNK-min_request);
    /* Try to get space, if fail reduce slop and try again */
    for (;;) {
      hdr_ptr = (small_pool_ptr) jpeg_get_small(cinfo, min_request + slop);
      if (hdr_ptr != NULL)
	break;
      slop /= 2;
      if (slop < MIN_SLOP)	/* give up when it gets real small */
	out_of_memory(cinfo, 2); /* jpeg_get_small failed */
    }
    mem->total_space_allocated += min_request + slop;
    /* Success, initialize the new pool header and add to end of list */
    hdr_ptr->hdr.next = NULL;
    hdr_ptr->hdr.bytes_used = 0;
    hdr_ptr->hdr.bytes_left = sizeofobject + slop;
    if (prev_hdr_ptr == NULL)	/* first pool in class? */
      mem->small_list[pool_id] = hdr_ptr;
    else
      prev_hdr_ptr->hdr.next = hdr_ptr;
  }

  /* OK, allocate the object from the current pool */
  data_ptr = (char *) (hdr_ptr + 1); /* point to first data byte in pool */
  data_ptr += hdr_ptr->hdr.bytes_used; /* point to place for object */
  hdr_ptr->hdr.bytes_used += sizeofobject;
  hdr_ptr->hdr.bytes_left -= sizeofobject;

  return (void *) data_ptr;
}